

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# akarin_camera_system.cpp
# Opt level: O0

mat4 * AkarinCameraSystem::get_projection(void)

{
  mat<4,_4,_float,_(glm::qualifier)0> *in_RDI;
  float fovy;
  float aspect;
  
  fovy = glm::radians<float>(akarin_camera.m_zoom);
  aspect = AkarinGLFW::get_window_size_ratio();
  glm::perspective<float>(in_RDI,fovy,aspect,akarin_camera.clip_near,akarin_camera.clip_far);
  return in_RDI;
}

Assistant:

glm::mat4 AkarinCameraSystem::get_projection() noexcept
{
    return glm::perspective(
        glm::radians(akarin_camera.m_zoom),
        AkarinGLFW::get_window_size_ratio(),
        akarin_camera.clip_near,
        akarin_camera.clip_far);
}